

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_common.h
# Opt level: O0

const_bf_iterator *
bf_j<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>>
          (node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
           *t)

{
  int iVar1;
  node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
  *t_local;
  
  if (bf_j<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>>(st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>const&)
      ::j == '\0') {
    iVar1 = __cxa_guard_acquire(&bf_j<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>>(st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>const&)
                                 ::j);
    if (iVar1 != 0) {
      st_tree::detail::
      b1st_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_const_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::allocator<int>_>
      ::b1st_iterator(&bf_j<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_>
                       ::j);
      __cxa_atexit(st_tree::detail::
                   b1st_iterator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_const_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::allocator<int>_>
                   ::~b1st_iterator,
                   &bf_j<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_>
                    ::j,&__dso_handle);
      __cxa_guard_release(&bf_j<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>>(st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>const&)
                           ::j);
    }
  }
  return &bf_j<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_>
          ::j;
}

Assistant:

typename Tree::const_bf_iterator& bf_j(const Tree& t) {
    static typename Tree::const_bf_iterator j;
    return j;
}